

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Code.cpp
# Opt level: O0

void Code::FinalShell(void)

{
  unsigned_long *puVar1;
  bool bVar2;
  int iVar3;
  ostream *this;
  Runtime *pRVar4;
  string *this_00;
  string *this_01;
  Bracket *this_02;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  Bracket *local_40;
  Bracket *bracket;
  unsigned_long *pos;
  string *temp;
  string *sourceCode;
  Runtime *local_10;
  Runtime *runtime;
  
  this = std::operator<<((ostream *)&std::cout,"Final Is Not Another Lisp!");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,">>> ");
  pRVar4 = (Runtime *)operator_new(8);
  Runtime::Runtime(pRVar4);
  local_10 = pRVar4;
  this_00 = (string *)operator_new(0x20);
  std::__cxx11::string::string((string *)this_00);
  temp = this_00;
  this_01 = (string *)operator_new(0x20);
  std::__cxx11::string::string(this_01);
  pos = (unsigned_long *)this_01;
  bracket = (Bracket *)operator_new(8);
  (bracket->super_Atom)._vptr_Atom = (_func_int **)0x0;
  do {
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)temp);
    while (bVar2 = isValidCode(temp), ((bVar2 ^ 0xffU) & 1) != 0) {
      std::operator<<((ostream *)&std::cout,"... ");
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&std::cin,(string *)pos);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              pos,"");
      if (bVar2) {
        std::__cxx11::string::operator=((string *)temp,(string *)pos);
        break;
      }
      std::operator+(&local_60," ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pos);
      std::__cxx11::string::operator+=((string *)temp,(string *)&local_60);
      std::__cxx11::string::~string((string *)&local_60);
    }
    bVar2 = std::operator==(temp,"");
    pRVar4 = local_10;
    if (bVar2) {
      if (local_10 != (Runtime *)0x0) {
        Runtime::~Runtime(local_10);
        operator_delete(pRVar4);
      }
      puVar1 = pos;
      if (pos != (unsigned_long *)0x0) {
        std::__cxx11::string::~string((string *)pos);
        operator_delete(puVar1);
      }
      if (bracket != (Bracket *)0x0) {
        operator_delete(bracket);
      }
      return;
    }
    (bracket->super_Atom)._vptr_Atom = (_func_int **)0x0;
    this_02 = (Bracket *)operator_new(0x40);
    Bracket::Bracket(this_02,temp,(unsigned_long *)bracket);
    local_40 = this_02;
    iVar3 = (*(this_02->super_Atom)._vptr_Atom[3])(this_02,local_10);
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x10))();
    if (local_40 != (Bracket *)0x0) {
      (*(local_40->super_Atom)._vptr_Atom[1])();
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout,">>> ");
  } while( true );
}

Assistant:

void Code::FinalShell() {
    std::cout << "Final Is Not Another Lisp!" << std::endl;
    std::cout << ">>> ";
    auto runtime = new Runtime();
    auto sourceCode = new std::string;
    auto temp = new std::string;
    auto pos = new unsigned long(0);
    Bracket *bracket;
    while (true) {
        std::getline(std::cin, *sourceCode);
        while (!isValidCode(*sourceCode)) {
            std::cout << "... ";
            std::getline(std::cin, *temp);
            if (*temp == "") {
                *sourceCode = *temp;
                break;
            }
            *sourceCode += " " + *temp;
        }
        if (*sourceCode == "") {
            break;
        }
        *pos = 0;
        bracket = new Bracket(*sourceCode, *pos);
        bracket->eval(runtime)->print();
        delete bracket;
        std::cout << std::endl;
        std::cout << ">>> ";
    }
    delete runtime;
    delete temp;
    delete pos;
}